

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O2

int __thiscall
CDesign::GetNetInBBox(CDesign *this,vector<CNet_*,_std::allocator<CNet_*>_> *pNetList,CBBox *pBBox)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  CNet *pNet;
  CNet *local_38;
  
  if ((pNetList != (vector<CNet_*,_std::allocator<CNet_*>_> *)0x0) &&
     ((pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    __assert_fail("pNetList==NULL||pNetList->size()==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                  ,0x5a8,"int CDesign::GetNetInBBox(vector<CNet *> *, CBBox *)");
  }
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < this->m_iNumNet; lVar3 = lVar3 + 1) {
    local_38 = this->m_ppNet[lVar3];
    if (local_38 != (CNet *)0x0) {
      iVar1 = CNet::IsRouted(local_38);
      if (iVar1 == 0) {
        CNet::UpdateBBox(local_38);
        iVar1 = CBBox::IsInside(pBBox,&local_38->m_BBox);
        if (iVar1 != 0) {
          iVar2 = iVar2 + 1;
          if (pNetList != (vector<CNet_*,_std::allocator<CNet_*>_> *)0x0) {
            std::vector<CNet_*,_std::allocator<CNet_*>_>::push_back(pNetList,&local_38);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int CDesign::GetNetInBBox(vector<CNet*>* pNetList, CBBox* pBBox/*, int iMode, int iValue*/)
{
	//collect the all nets within the give box, satisfying the given condition (property/state)
	assert(pNetList==NULL||pNetList->size()==0);
	
	int	iNumNet	=	0;
	for (int i=0;i<m_iNumNet;++i)
	{
		CNet*	pNet	=	GetNet(i);
		
		if(!pNet)	continue;
		assert(pNet);

		//int		iContinue	=	TRUE;

		//switch(iMode){
		//case GET_MODE_STATE:
		//	if(pNet->GetState()&iValue)	iContinue	=	FALSE;
		//	break;
		//case GET_MODE_PROP:
		//	if(pNet->GetProp()&iValue)	iContinue	=	FALSE;
		//    break;
		//default:
		//    break;
		//}
		
		if(pNet->IsRouted())	continue;

		pNet->UpdateBBox();
		if(pBBox->IsInside(&pNet->m_BBox))
		{
			++iNumNet;
			if(pNetList)	pNetList->push_back(pNet);
		}		
	}
	
	return	iNumNet;
}